

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O0

void __thiscall SQCompilation::DeclGroup::addDeclaration(DeclGroup *this,VarDecl *d)

{
  int iVar1;
  Node *in_RSI;
  Node *in_RDI;
  
  ArenaVector<SQCompilation::VarDecl_*>::push_back
            ((ArenaVector<SQCompilation::VarDecl_*> *)in_RSI,(VarDecl **)in_RDI);
  iVar1 = Node::lineEnd(in_RSI);
  Node::setLineEndPos(in_RDI,iVar1);
  iVar1 = Node::columnEnd(in_RSI);
  Node::setColumnEndPos(in_RDI,iVar1);
  return;
}

Assistant:

void addDeclaration(VarDecl *d) {
      _decls.push_back(d);
      setLineEndPos(d->lineEnd());
      setColumnEndPos(d->columnEnd());
    }